

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFVersion.cc
# Opt level: O2

bool __thiscall PDFVersion::operator<(PDFVersion *this,PDFVersion *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if (rhs->major_version <= this->major_version) {
    if (this->major_version <= rhs->major_version) {
      if (this->minor_version < rhs->minor_version) {
        return true;
      }
      if (this->minor_version <= rhs->minor_version) {
        return this->extension_level < rhs->extension_level;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
PDFVersion::operator<(PDFVersion const& rhs) const
{
    return (
        (this->major_version < rhs.major_version)           ? true
            : (this->major_version > rhs.major_version)     ? false
            : (this->minor_version < rhs.minor_version)     ? true
            : (this->minor_version > rhs.minor_version)     ? false
            : (this->extension_level < rhs.extension_level) ? true
                                                            : false);
}